

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-sendmsg.c
# Opt level: O0

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if (tcp == (uv_stream_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x55,"tcp != NULL");
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
              ,0x5b,"nread == UV_EOF");
      abort();
    }
    printf("GOT EOF\n");
    uv_close(tcp,close_cb);
  }
  else {
    bytes_received_done = nread + bytes_received_done;
  }
  free(buf->base);
  return;
}

Assistant:

static void read_cb(uv_stream_t* handle,
                    ssize_t nread,
                    const uv_buf_t* buf) {
  uv_pipe_t* p;
  uv_pipe_t* inc;
  uv_handle_type pending;
  unsigned int i;

  p = (uv_pipe_t*) handle;
  ASSERT(nread >= 0);

  while (uv_pipe_pending_count(p) != 0) {
    pending = uv_pipe_pending_type(p);
    ASSERT(pending == UV_NAMED_PIPE);

    ASSERT(incoming_count < ARRAY_SIZE(incoming));
    inc = &incoming[incoming_count++];
    ASSERT(0 == uv_pipe_init(p->loop, inc, 0));
    ASSERT(0 == uv_accept(handle, (uv_stream_t*) inc));
  }

  if (incoming_count != ARRAY_SIZE(incoming))
    return;

  ASSERT(0 == uv_read_stop((uv_stream_t*) p));
  uv_close((uv_handle_t*) p, close_cb);
  for (i = 0; i < ARRAY_SIZE(incoming); i++)
    uv_close((uv_handle_t*) &incoming[i], close_cb);
}